

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O2

int encode_frame(LINK_ENDPOINT_HANDLE link_endpoint,AMQP_VALUE performative,PAYLOAD *payloads,
                size_t payload_count)

{
  int iVar1;
  
  iVar1 = connection_encode_frame
                    (link_endpoint->session->endpoint,performative,(PAYLOAD *)0x0,0,
                     (ON_SEND_COMPLETE)0x0,(void *)0x0);
  if (iVar1 != 0) {
    iVar1 = 0x4e6;
  }
  return iVar1;
}

Assistant:

static int encode_frame(LINK_ENDPOINT_HANDLE link_endpoint, AMQP_VALUE performative, PAYLOAD* payloads, size_t payload_count)
{
    int result;

    if ((link_endpoint == NULL) ||
        (performative == NULL))
    {
        result = MU_FAILURE;
    }
    else
    {
        LINK_ENDPOINT_INSTANCE* link_endpoint_instance = (LINK_ENDPOINT_INSTANCE*)link_endpoint;
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)link_endpoint_instance->session;

        if (connection_encode_frame(session_instance->endpoint, performative, payloads, payload_count, NULL, NULL) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }

    return result;
}